

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Gia_Man_t * Gia_ManSimPatGenMiter(Gia_Man_t *p,Vec_Wrd_t *vSims)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar5;
  word *pIn1;
  bool bVar6;
  word *pSim;
  int nWords;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Wrd_t *vSims_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WrdSize(vSims);
  iVar2 = Gia_ManObjNum(p);
  iVar1 = iVar1 / iVar2;
  iVar2 = Gia_ManObjNum(p);
  iVar3 = Gia_ManCoNum(p);
  p_00 = Gia_ManStart(iVar2 + iVar3);
  Gia_ManHashStart(p_00);
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  pSim._4_4_ = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (pSim._4_4_ < iVar2) {
      _nWords = Gia_ManCi(p,pSim._4_4_);
      bVar6 = _nWords != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar4 = Gia_ManAppendCi(p_00);
    _nWords->Value = uVar4;
    pSim._4_4_ = pSim._4_4_ + 1;
  }
  pSim._4_4_ = 0;
  while( true ) {
    bVar6 = false;
    if (pSim._4_4_ < p->nObjs) {
      _nWords = Gia_ManObj(p,pSim._4_4_);
      bVar6 = _nWords != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Gia_ObjIsAnd(_nWords);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjFanin0Copy(_nWords);
      iVar3 = Gia_ObjFanin1Copy(_nWords);
      uVar4 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      _nWords->Value = uVar4;
    }
    pSim._4_4_ = pSim._4_4_ + 1;
  }
  pSim._4_4_ = 0;
  while( true ) {
    bVar6 = false;
    if (pSim._4_4_ < p->nObjs) {
      _nWords = Gia_ManObj(p,pSim._4_4_);
      bVar6 = _nWords != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Gia_ObjIsAnd(_nWords);
    if (iVar2 != 0) {
      pIn1 = Vec_WrdEntryP(vSims,pSim._4_4_ * iVar1);
      iVar2 = Abc_TtIsConst0(pIn1,iVar1);
      if (iVar2 != 0) {
        iVar2 = Abc_LitNotCond(_nWords->Value,0);
        Gia_ManAppendCo(p_00,iVar2);
      }
      iVar2 = Abc_TtIsConst1(pIn1,iVar1);
      if (iVar2 != 0) {
        iVar2 = Abc_LitNotCond(_nWords->Value,1);
        Gia_ManAppendCo(p_00,iVar2);
      }
    }
    pSim._4_4_ = pSim._4_4_ + 1;
  }
  Gia_ManHashStop(p_00);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManSimPatGenMiter( Gia_Man_t * p, Vec_Wrd_t * vSims )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nWords = Vec_WrdSize(vSims) / Gia_ManObjNum(p);
    pNew = Gia_ManStart( Gia_ManObjNum(p) + Gia_ManCoNum(p) );
    Gia_ManHashStart( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        word * pSim = Vec_WrdEntryP(vSims, i*nWords);
        if ( Abc_TtIsConst0(pSim, nWords) )
            Gia_ManAppendCo( pNew, Abc_LitNotCond(pObj->Value, 0) );
        if ( Abc_TtIsConst1(pSim, nWords) )
            Gia_ManAppendCo( pNew, Abc_LitNotCond(pObj->Value, 1) );
    }
    Gia_ManHashStop( pNew );
    return pNew;
}